

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O2

QMessageBoxPrivate * __thiscall
QMessageBoxPrivate::standardIcon(QMessageBoxPrivate *this,Icon icon,QMessageBox *mb)

{
  long lVar1;
  char cVar2;
  undefined4 uVar3;
  QStyle *pQVar4;
  long lVar5;
  long in_FS_OFFSET;
  double dVar6;
  undefined8 uStack_50;
  QIcon local_40;
  QIcon tmpIcon;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (mb == (QMessageBox *)0x0) {
    pQVar4 = QApplication::style();
  }
  else {
    pQVar4 = QWidget::style((QWidget *)mb);
  }
  uVar3 = (**(code **)(*(long *)pQVar4 + 0xe0))(pQVar4,0x47,0,mb);
  tmpIcon.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QIcon::QIcon(&tmpIcon);
  switch(icon) {
  case Information:
    lVar5 = *(long *)pQVar4;
    uStack_50 = 9;
    break;
  case Warning:
    lVar5 = *(long *)pQVar4;
    uStack_50 = 10;
    break;
  case Critical:
    lVar5 = *(long *)pQVar4;
    uStack_50 = 0xb;
    break;
  case Question:
    lVar5 = *(long *)pQVar4;
    uStack_50 = 0xc;
    break;
  default:
    goto switchD_004ba410_default;
  }
  (**(code **)(lVar5 + 0x100))(&local_40,pQVar4,uStack_50,0,mb);
  QIcon::operator=(&tmpIcon,&local_40);
  QIcon::~QIcon(&local_40);
switchD_004ba410_default:
  cVar2 = QIcon::isNull();
  if (cVar2 == '\0') {
    if (mb == (QMessageBox *)0x0) {
      dVar6 = (double)QGuiApplication::devicePixelRatio();
    }
    else {
      dVar6 = (double)QPaintDevice::devicePixelRatio();
    }
    local_40.d._0_4_ = uVar3;
    local_40.d._4_4_ = uVar3;
    QIcon::pixmap((QSize *)this,dVar6,(Mode)&tmpIcon,(State)&local_40);
  }
  else {
    QPixmap::QPixmap((QPixmap *)this);
  }
  QIcon::~QIcon(&tmpIcon);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

QPixmap QMessageBoxPrivate::standardIcon(QMessageBox::Icon icon, QMessageBox *mb)
{
    QStyle *style = mb ? mb->style() : QApplication::style();
    int iconSize = style->pixelMetric(QStyle::PM_MessageBoxIconSize, nullptr, mb);
    QIcon tmpIcon;
    switch (icon) {
    case QMessageBox::Information:
        tmpIcon = style->standardIcon(QStyle::SP_MessageBoxInformation, nullptr, mb);
        break;
    case QMessageBox::Warning:
        tmpIcon = style->standardIcon(QStyle::SP_MessageBoxWarning, nullptr, mb);
        break;
    case QMessageBox::Critical:
        tmpIcon = style->standardIcon(QStyle::SP_MessageBoxCritical, nullptr, mb);
        break;
    case QMessageBox::Question:
        tmpIcon = style->standardIcon(QStyle::SP_MessageBoxQuestion, nullptr, mb);
        break;
    default:
        break;
    }
    if (!tmpIcon.isNull()) {
        qreal dpr = mb ? mb->devicePixelRatio() : qApp->devicePixelRatio();
        return tmpIcon.pixmap(QSize(iconSize, iconSize), dpr);
    }
    return QPixmap();
}